

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O2

int parse_servercmd(httprequest *req)

{
  char cVar1;
  uint uVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar3;
  int extraout_EAX_01;
  char *pcVar4;
  FILE *__stream;
  uint *puVar5;
  char *pcVar6;
  int num;
  char *orgcmd;
  size_t cmdsize;
  
  pcVar4 = test2file(req->testno);
  req->close = false;
  __stream = fopen64(pcVar4,"rb");
  if (__stream == (FILE *)0x0) {
    puVar5 = (uint *)__errno_location();
    uVar2 = *puVar5;
    pcVar6 = strerror(uVar2);
    logmsg("fopen() failed with error: %d %s",(ulong)uVar2,pcVar6);
    logmsg("  [1] Error opening file: %s",pcVar4);
    logmsg("  Couldn\'t open test file %ld",req->testno);
    iVar3 = extraout_EAX_00;
  }
  else {
    orgcmd = (char *)0x0;
    cmdsize = 0;
    num = 0;
    uVar2 = getpart(&orgcmd,&cmdsize,"reply","servercmd",(FILE *)__stream);
    fclose(__stream);
    if (uVar2 == 0) {
      req->connmon = false;
      pcVar4 = orgcmd;
      do {
        if ((pcVar4 == (char *)0x0) || (cmdsize == 0)) break;
        iVar3 = strncmp("auth_required",pcVar4,0xd);
        if (iVar3 == 0) {
          logmsg("instructed to require authorization header");
          req->auth_req = true;
        }
        else {
          iVar3 = strncmp("idle",pcVar4,4);
          if (iVar3 == 0) {
            logmsg("instructed to idle");
            req->rcmd = 1;
            req->open = true;
          }
          else {
            iVar3 = strncmp("stream",pcVar4,6);
            if (iVar3 == 0) {
              logmsg("instructed to stream");
              req->rcmd = 2;
            }
            else {
              iVar3 = strncmp("connection-monitor",pcVar4,0x12);
              if (iVar3 == 0) {
                logmsg("enabled connection monitoring");
                req->connmon = true;
              }
              else {
                iVar3 = strncmp("upgrade",pcVar4,7);
                if (iVar3 == 0) {
                  logmsg("enabled upgrade to http2");
                  req->upgrade = true;
                }
                else {
                  iVar3 = strncmp("swsclose",pcVar4,8);
                  if (iVar3 == 0) {
                    logmsg("swsclose: close this connection after response");
                    req->close = true;
                  }
                  else {
                    iVar3 = __isoc99_sscanf(pcVar4,"skip: %d",&num);
                    if (iVar3 == 1) {
                      logmsg("instructed to skip this number of bytes %d",(ulong)(uint)num);
                      req->skip = num;
                    }
                    else {
                      iVar3 = __isoc99_sscanf(pcVar4,"writedelay: %d",&num);
                      if (iVar3 == 1) {
                        logmsg("instructed to delay %d secs between packets",(ulong)(uint)num);
                        req->writedelay = num;
                      }
                      else {
                        logmsg("Unknown <servercmd> instruction found: %s",pcVar4);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        pcVar6 = strchr(pcVar4,0xd);
        if ((pcVar6 == (char *)0x0) && (pcVar6 = strchr(pcVar4,10), pcVar6 == (char *)0x0)) break;
        for (; (cVar1 = *pcVar6, cVar1 == '\n' || (cVar1 == '\r')); pcVar6 = pcVar6 + 1) {
        }
        pcVar4 = pcVar6;
      } while (cVar1 != '\0');
      free(orgcmd);
      return extraout_EAX_01;
    }
    logmsg("getpart() failed with error: %d",(ulong)uVar2);
    iVar3 = extraout_EAX;
  }
  req->open = false;
  return iVar3;
}

Assistant:

static int parse_servercmd(struct httprequest *req)
{
  FILE *stream;
  char *filename;
  int error;

  filename = test2file(req->testno);
  req->close = FALSE;
  stream = fopen(filename, "rb");
  if(!stream) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("  [1] Error opening file: %s", filename);
    logmsg("  Couldn't open test file %ld", req->testno);
    req->open = FALSE; /* closes connection */
    return 1; /* done */
  }
  else {
    char *orgcmd = NULL;
    char *cmd = NULL;
    size_t cmdsize = 0;
    int num = 0;

    /* get the custom server control "commands" */
    error = getpart(&orgcmd, &cmdsize, "reply", "servercmd", stream);
    fclose(stream);
    if(error) {
      logmsg("getpart() failed with error: %d", error);
      req->open = FALSE; /* closes connection */
      return 1; /* done */
    }

    req->connmon = FALSE;

    cmd = orgcmd;
    while(cmd && cmdsize) {
      char *check;

      if(!strncmp(CMD_AUTH_REQUIRED, cmd, strlen(CMD_AUTH_REQUIRED))) {
        logmsg("instructed to require authorization header");
        req->auth_req = TRUE;
      }
      else if(!strncmp(CMD_IDLE, cmd, strlen(CMD_IDLE))) {
        logmsg("instructed to idle");
        req->rcmd = RCMD_IDLE;
        req->open = TRUE;
      }
      else if(!strncmp(CMD_STREAM, cmd, strlen(CMD_STREAM))) {
        logmsg("instructed to stream");
        req->rcmd = RCMD_STREAM;
      }
      else if(!strncmp(CMD_CONNECTIONMONITOR, cmd,
                       strlen(CMD_CONNECTIONMONITOR))) {
        logmsg("enabled connection monitoring");
        req->connmon = TRUE;
      }
      else if(!strncmp(CMD_UPGRADE, cmd, strlen(CMD_UPGRADE))) {
        logmsg("enabled upgrade to http2");
        req->upgrade = TRUE;
      }
      else if(!strncmp(CMD_SWSCLOSE, cmd, strlen(CMD_SWSCLOSE))) {
        logmsg("swsclose: close this connection after response");
        req->close = TRUE;
      }
      else if(1 == sscanf(cmd, "skip: %d", &num)) {
        logmsg("instructed to skip this number of bytes %d", num);
        req->skip = num;
      }
      else if(1 == sscanf(cmd, "writedelay: %d", &num)) {
        logmsg("instructed to delay %d secs between packets", num);
        req->writedelay = num;
      }
      else {
        logmsg("Unknown <servercmd> instruction found: %s", cmd);
      }
      /* try to deal with CRLF or just LF */
      check = strchr(cmd, '\r');
      if(!check)
        check = strchr(cmd, '\n');

      if(check) {
        /* get to the letter following the newline */
        while((*check == '\r') || (*check == '\n'))
          check++;

        if(!*check)
          /* if we reached a zero, get out */
          break;
        cmd = check;
      }
      else
        break;
    }
    free(orgcmd);
  }

  return 0; /* OK! */
}